

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int open_input(char *name)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  char temp [128];
  
  iVar1 = infile_num;
  lVar6 = (long)infile_num;
  if (lVar6 != 0) {
    if (infile_num == 7) {
      pcVar5 = "Too many include levels, max. 7!";
      goto LAB_0010ce44;
    }
    input_file[lVar6].lnum = slnum;
    input_file[lVar6].fp = in_fp;
  }
  strcpy(temp,name);
  pcVar5 = strrchr(temp,0x2e);
  if ((pcVar5 == (char *)0x0) || (pcVar5 = strchr(pcVar5,0x2f), pcVar5 != (char *)0x0)) {
    sVar2 = strlen(temp);
    builtin_strncpy(temp + sVar2,".asm",5);
  }
  if (iVar1 == 0) {
LAB_0010ce50:
    pFVar3 = open_file(temp,"r");
    if (pFVar3 == (FILE *)0x0) {
      return -1;
    }
    slnum = 0;
    uVar4 = (long)infile_num + 1;
    infile_num = (int)uVar4;
    in_fp = pFVar3;
    input_file[uVar4].fp = pFVar3;
    input_file[uVar4].if_level = if_level;
    strcpy(input_file[uVar4].name,temp);
    if (pass != 1) {
      return 0;
    }
    if (xlist == 0) {
      return 0;
    }
    if (list_level == 0) {
      return 0;
    }
    fprintf((FILE *)lst_fp,"#[%i]   %s\n",uVar4 & 0xffffffff,input_file[uVar4].name);
    return 0;
  }
  lVar7 = 0;
  pcVar5 = input_file[1].name;
  do {
    lVar7 = lVar7 + 1;
    if (lVar6 <= lVar7) goto LAB_0010ce50;
    iVar1 = strcmp(pcVar5,temp);
    pcVar5 = pcVar5 + 0x88;
  } while (iVar1 != 0);
  pcVar5 = "Repeated include file!";
LAB_0010ce44:
  error(pcVar5);
  return 1;
}

Assistant:

int
open_input(char *name)
{
	FILE *fp;
	char *p;
	char  temp[128];
	int   i;

	/* only 7 nested input files */
	if (infile_num == 7) {
		error("Too many include levels, max. 7!");
		return (1);
	}

	/* backup current input file infos */
	if (infile_num) {
		input_file[infile_num].lnum = slnum;
		input_file[infile_num].fp = in_fp;
	}				

	/* get a copy of the file name */
	strcpy(temp, name);

	/* auto add the .asm file extension */
	if ((p = strrchr(temp, '.')) != NULL) {
		if (strchr(p, PATH_SEPARATOR))
			strcat(temp, ".asm");
	}
	else {
		strcat(temp, ".asm");
	}

	/* check if this file is already opened */
	if (infile_num) {
		for (i = 1; i < infile_num; i++) {
			if (!strcmp(input_file[i].name, temp)) {
				error("Repeated include file!");
				return (1);
			}
		}
	}				

	/* open the file */
	if ((fp = open_file(temp, "r")) == NULL)
		return (-1);

	/* update input file infos */
	in_fp = fp;
	slnum = 0;
	infile_num++;
	input_file[infile_num].fp = fp;
	input_file[infile_num].if_level = if_level;
	strcpy(input_file[infile_num].name, temp);
	if ((pass == LAST_PASS) && (xlist) && (list_level))
		fprintf(lst_fp, "#[%i]   %s\n", infile_num, input_file[infile_num].name);

	/* ok */
	return (0);
}